

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void google::protobuf::compiler::CommandLineInterface::GetTransitiveDependencies
               (FileDescriptor *file,bool include_json_name,bool include_source_code_info,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *already_seen,RepeatedPtrField<google::protobuf::FileDescriptorProto> *output)

{
  FileDescriptor *file_00;
  FileDescriptorProto *proto;
  undefined7 in_register_00000011;
  int i;
  int index;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar1;
  FileDescriptor *local_40;
  undefined4 local_34;
  
  local_40 = file;
  pVar1 = std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)already_seen,&local_40);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_34 = (undefined4)CONCAT71(in_register_00000011,include_source_code_info);
    for (index = 0; index < *(int *)(local_40 + 0x18); index = index + 1) {
      file_00 = FileDescriptor::dependency(local_40,index);
      GetTransitiveDependencies
                (file_00,include_json_name,include_source_code_info,already_seen,output);
    }
    proto = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(output);
    FileDescriptor::CopyTo(local_40,proto);
    if (include_json_name) {
      FileDescriptor::CopyJsonNameTo(local_40,proto);
    }
    if ((char)local_34 != '\0') {
      FileDescriptor::CopySourceCodeInfoTo(local_40,proto);
    }
  }
  return;
}

Assistant:

void CommandLineInterface::GetTransitiveDependencies(
    const FileDescriptor* file,
    bool include_json_name,
    bool include_source_code_info,
    std::set<const FileDescriptor*>* already_seen,
    RepeatedPtrField<FileDescriptorProto>* output) {
  if (!already_seen->insert(file).second) {
    // Already saw this file.  Skip.
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); i++) {
    GetTransitiveDependencies(file->dependency(i),
                              include_json_name,
                              include_source_code_info,
                              already_seen, output);
  }

  // Add this file.
  FileDescriptorProto* new_descriptor = output->Add();
  file->CopyTo(new_descriptor);
  if (include_json_name) {
    file->CopyJsonNameTo(new_descriptor);
  }
  if (include_source_code_info) {
    file->CopySourceCodeInfoTo(new_descriptor);
  }
}